

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_symbols.hpp
# Opt level: O2

Elf_Xword __thiscall
ELFIO::symbol_section_accessor_template<ELFIO::section>::
generic_arrange_local_symbols<ELFIO::Elf32_Sym>
          (symbol_section_accessor_template<ELFIO::section> *this,
          function<void_(unsigned_long,_unsigned_long)> *func)

{
  Elf32_Addr EVar1;
  Elf_Word EVar2;
  uchar uVar3;
  uchar uVar4;
  Elf_Half EVar5;
  Elf_Xword EVar6;
  ulong uVar7;
  Elf32_Sym *pEVar8;
  Elf32_Sym *pEVar9;
  ulong index;
  ulong index_00;
  ulong local_48;
  undefined8 uStack_40;
  
  EVar6 = get_symbols_num(this);
  pEVar8 = (Elf32_Sym *)0x0;
  uVar7 = 1;
  do {
    index_00 = uVar7;
    uVar7 = (ulong)((int)index_00 + 1);
    while ((index = uVar7, EVar6 <= index_00 ||
           (pEVar8 = generic_get_symbol_ptr<ELFIO::Elf32_Sym>(this,index_00), 0xf < pEVar8->st_info)
           )) {
      while( true ) {
        if (EVar6 <= index) goto LAB_00108521;
        pEVar9 = generic_get_symbol_ptr<ELFIO::Elf32_Sym>(this,index);
        if (pEVar9->st_info < 0x10) break;
        index = index + 1;
      }
      if ((EVar6 <= index) || (EVar6 <= index_00)) {
LAB_00108521:
        local_48 = CONCAT44(local_48._4_4_,(int)index_00);
        (*this->symbol_section->_vptr_section[10])(this->symbol_section,&local_48);
        return local_48 & 0xffffffff;
      }
      if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
        std::function<void_(unsigned_long,_unsigned_long)>::operator()(func,index_00,index);
      }
      local_48._0_4_ = pEVar8->st_name;
      local_48._4_4_ = pEVar8->st_value;
      uStack_40._0_4_ = pEVar8->st_size;
      uStack_40._4_1_ = pEVar8->st_info;
      uStack_40._5_1_ = pEVar8->st_other;
      uStack_40._6_2_ = pEVar8->st_shndx;
      EVar1 = pEVar9->st_value;
      EVar2 = pEVar9->st_size;
      uVar3 = pEVar9->st_info;
      uVar4 = pEVar9->st_other;
      EVar5 = pEVar9->st_shndx;
      pEVar8->st_name = pEVar9->st_name;
      pEVar8->st_value = EVar1;
      pEVar8->st_size = EVar2;
      pEVar8->st_info = uVar3;
      pEVar8->st_other = uVar4;
      pEVar8->st_shndx = EVar5;
      pEVar9->st_name = (undefined4)local_48;
      pEVar9->st_value = local_48._4_4_;
      pEVar9->st_size = (undefined4)uStack_40;
      pEVar9->st_info = uStack_40._4_1_;
      pEVar9->st_other = uStack_40._5_1_;
      pEVar9->st_shndx = uStack_40._6_2_;
      pEVar8 = (Elf32_Sym *)0x0;
    }
  } while( true );
}

Assistant:

Elf_Xword generic_arrange_local_symbols(
        std::function<void( Elf_Xword first, Elf_Xword second )> func )
    {
        const endianness_convertor& convertor = elf_file.get_convertor();

        Elf_Word first_not_local =
            1; // Skip the first entry. It is always NOTYPE
        Elf_Xword current = 0;
        Elf_Xword count   = get_symbols_num();

        while ( true ) {
            T* p1 = nullptr;
            T* p2 = nullptr;

            while ( first_not_local < count ) {
                p1 = const_cast<T*>(
                    generic_get_symbol_ptr<T>( first_not_local ) );
                if ( ELF_ST_BIND( convertor( p1->st_info ) ) != STB_LOCAL )
                    break;
                ++first_not_local;
            }

            current = first_not_local + 1;
            while ( current < count ) {
                p2 = const_cast<T*>( generic_get_symbol_ptr<T>( current ) );
                if ( ELF_ST_BIND( convertor( p2->st_info ) ) == STB_LOCAL )
                    break;
                ++current;
            }

            if ( first_not_local < count && current < count ) {
                if ( func )
                    func( first_not_local, current );

                std::swap( *p1, *p2 );
            }
            else {
                // Update 'info' field of the section
                symbol_section->set_info( first_not_local );
                break;
            }
        }

        return first_not_local;
    }